

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindowSettings * ImGui::CreateNewWindowSettings(char *name)

{
  int iVar1;
  ImGuiWindowSettings *pIVar2;
  ImGuiContext *pIVar3;
  ImU32 IVar4;
  char *pcVar5;
  ImGuiWindowSettings *pIVar6;
  ImGuiWindowSettings IStack_38;
  
  pIVar3 = GImGui;
  IStack_38._16_5_ = 0;
  IStack_38._21_8_ = 0;
  IStack_38.Name = (char *)0x0;
  IStack_38._8_5_ = 0;
  IStack_38.Pos.x._1_3_ = 0;
  ImVector<ImGuiWindowSettings>::push_back(&GImGui->SettingsWindows,&IStack_38);
  pIVar2 = (pIVar3->SettingsWindows).Data;
  iVar1 = (pIVar3->SettingsWindows).Size;
  pIVar6 = pIVar2 + (long)iVar1 + -1;
  pcVar5 = ImStrdup(name);
  pIVar6->Name = pcVar5;
  IVar4 = ImHash(name,0,0);
  pIVar2[(long)iVar1 + -1].ID = IVar4;
  return pIVar6;
}

Assistant:

ImGuiWindowSettings* ImGui::CreateNewWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    g.SettingsWindows.push_back(ImGuiWindowSettings());
    ImGuiWindowSettings* settings = &g.SettingsWindows.back();
    settings->Name = ImStrdup(name);
    settings->ID = ImHash(name, 0);
    return settings;
}